

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Opnd * Lowerer::GetMissingItemOpndForCompare(IRType type,Func *func)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  Opnd *pOVar4;
  intptr_t pMemLoc;
  MemRefOpnd *pMVar5;
  ulong uVar6;
  undefined4 *puVar7;
  IntConstOpnd *src;
  RegOpnd *pRVar8;
  Instr *in_RCX;
  LabelInstr *labelFail;
  int iVar9;
  undefined7 in_register_00000039;
  undefined8 *puVar10;
  char in_R8B;
  
  puVar10 = (undefined8 *)CONCAT71(in_register_00000039,type);
  iVar9 = (int)puVar10;
  if (iVar9 != 0x17) {
    if (iVar9 == 10) {
      pMemLoc = ThreadContextInfo::GetNativeFloatArrayMissingItemAddr(func->m_threadContextInfo);
      pMVar5 = IR::MemRefOpnd::New(pMemLoc,TyUint64,func,AddrOpndKindDynamicMisc);
      return &pMVar5->super_Opnd;
    }
    if (iVar9 != 3) {
      GetMissingItemOpndForCompare();
      uVar6 = (ulong)*(byte *)((long)&func->m_runtimeInfo + 2);
      if (uVar6 == 0x17) {
        bVar2 = IR::Opnd::IsNotInt((Opnd *)func);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x466e,"(!opnd->IsNotInt())",
                             "An opnd we know is not an int should not try to untag it as it will always fail"
                            );
          if (!bVar2) {
LAB_005e1f5d:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar7 = 0;
        }
        bVar2 = StackSym::IsIntConst((StackSym *)func->m_threadContextInfo);
        if (!bVar2) {
          if (in_R8B == '\0') {
            bVar2 = false;
          }
          else {
            bVar2 = IR::Opnd::IsTaggedInt((Opnd *)func);
            bVar2 = !bVar2;
          }
          pRVar8 = LowererMD::GenerateUntagVar
                             ((LowererMD *)(puVar10 + 1),(RegOpnd *)func,labelFail,in_RCX,bVar2);
          return &pRVar8->super_Opnd;
        }
        iVar3 = StackSym::GetIntConstValue((StackSym *)func->m_threadContextInfo);
        src = IR::IntConstOpnd::New((long)iVar3,TyInt32,(Func *)*puVar10,false);
        func = (Func *)IR::RegOpnd::New(TyInt32,(Func *)*puVar10);
        InsertMove((Opnd *)func,&src->super_Opnd,in_RCX,true);
      }
      else if (TySize[uVar6] != 4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x466b,"(opnd->GetSize() == 4)","This should be 32-bit wide");
        if (!bVar2) goto LAB_005e1f5d;
        *puVar7 = 0;
      }
      return (Opnd *)func;
    }
  }
  pOVar4 = GetMissingItemOpnd(type,func);
  return pOVar4;
}

Assistant:

IR::Opnd *
Lowerer::GetMissingItemOpndForCompare(IRType type, Func *func)
{
    switch (type)
    {
    case TyVar:
    case TyInt32:
        return GetMissingItemOpnd(type, func);

    case TyFloat64:
#if TARGET_64
        return IR::MemRefOpnd::New(func->GetThreadContextInfo()->GetNativeFloatArrayMissingItemAddr(), TyUint64, func);
#else
        return IR::MemRefOpnd::New(func->GetThreadContextInfo()->GetNativeFloatArrayMissingItemAddr(), TyUint32, func);
#endif

    default:
        AnalysisAssertMsg(false, "Unexpected type in Lowerer::GetMissingItemOpndForCompare");
        __assume(false);
    }
}